

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

void __thiscall cmCTestRunProcess::~cmCTestRunProcess(cmCTestRunProcess *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  
  if ((1 < this->PipeState + 1U) && (this->PipeState != 0xff)) {
    iVar3 = cmsysProcess_WaitForExit(this->Process,(double *)0x0);
    this->PipeState = iVar3;
  }
  cmsysProcess_Delete(this->Process);
  pcVar2 = (this->WorkingDirectory)._M_dataplus._M_p;
  paVar1 = &(this->WorkingDirectory).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->CommandLineStrings);
  return;
}

Assistant:

~cmCTestRunProcess()
  {
    if (this->PipeState != -1 && this->PipeState != cmsysProcess_Pipe_None &&
        this->PipeState != cmsysProcess_Pipe_Timeout) {
      this->WaitForExit();
    }
    cmsysProcess_Delete(this->Process);
  }